

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_name_unittest.cc
# Opt level: O3

void __thiscall
bssl::ParseNameTest_ConvertUniversalString_Test::TestBody
          (ParseNameTest_ConvertUniversalString_Test *this)

{
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr_2;
  string result;
  string result_unsafe;
  uint8_t der [24];
  AssertHelper local_e8;
  AssertHelper local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  undefined1 local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  AssertHelper local_90;
  string local_88;
  X509NameAttribute local_68;
  uchar local_38 [24];
  
  local_68.value.data_.data_ = local_38;
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = 'f';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = 'o';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = 'o';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = 'b';
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = 'a';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = 'r';
  local_68.type.data_.data_ = (uchar *)0x0;
  local_68.type.data_.size_ = 0;
  local_68.value_tag = 0x1c;
  local_68.value.data_.size_ = 0x18;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_d0[0] = (internal)X509NameAttribute::ValueAsStringUnsafe(&local_68,&local_88);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_d0[0]) {
    testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
              ((internal *)local_b0,"\"foobar\"","result_unsafe",(char (*) [7])"foobar",&local_88);
    if (local_b0[0] != (internal)0x0) {
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,local_a8);
      }
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_a0._M_local_buf[0] = '\0';
      local_b0 = (undefined1  [8])&local_a0;
      local_e0.data_._0_1_ =
           (internal)X509NameAttribute::ValueAsString(&local_68,(string *)local_b0);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_e0.data_._0_1_) {
        testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
                  ((internal *)local_d0,"\"foobar\"","result",(char (*) [7])"foobar",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
        if (local_d0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_e0);
          if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = "";
          }
          else {
            pcVar3 = (local_c8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_e8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
                     ,0xaa,pcVar3);
          testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
          testing::internal::AssertHelper::~AssertHelper(&local_e8);
          if ((long *)CONCAT71(local_e0.data_._1_7_,local_e0.data_._0_1_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_e0.data_._1_7_,local_e0.data_._0_1_) + 8))();
          }
        }
        if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8;
          pbVar1 = local_c8;
LAB_0027cd06:
          ::std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(pdVar2,pbVar1);
        }
      }
      else {
        pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8;
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d0,(internal *)&local_e0,
                   (AssertionResult *)"value.ValueAsString(&result)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
                   ,0xa9,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_d0._1_7_,local_d0[0]),local_c0._M_allocated_capacity + 1
                         );
        }
        if (local_e8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_e8.data_ + 8))();
        }
        pbVar1 = local_d8;
        if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_0027cd06;
      }
      if (local_b0 != (undefined1  [8])&local_a0) {
        operator_delete((void *)local_b0,
                        CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1)
        ;
      }
      goto LAB_0027cd22;
    }
    testing::Message::Message((Message *)local_d0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
               ,0xa7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((long *)CONCAT71(local_d0._1_7_,local_d0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_d0._1_7_,local_d0[0]) + 8))();
    }
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0027cd22;
    pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8;
    pbVar1 = local_a8;
  }
  else {
    testing::Message::Message((Message *)&local_e0);
    pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_c8;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)local_d0,
               (AssertionResult *)"value.ValueAsStringUnsafe(&result_unsafe)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
               ,0xa6,(char *)local_b0);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_b0 != (undefined1  [8])&local_a0) {
      operator_delete((void *)local_b0,
                      CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1);
    }
    if ((long *)CONCAT71(local_e0.data_._1_7_,local_e0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_e0.data_._1_7_,local_e0.data_._0_1_) + 8))();
    }
    pbVar1 = local_c8;
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0027cd22;
  }
  ::std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(pdVar2,pbVar1);
LAB_0027cd22:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST(ParseNameTest, ConvertUniversalString) {
  const uint8_t der[] = {0x00, 0x00, 0x00, 0x66, 0x00, 0x00, 0x00, 0x6f,
                         0x00, 0x00, 0x00, 0x6f, 0x00, 0x00, 0x00, 0x62,
                         0x00, 0x00, 0x00, 0x61, 0x00, 0x00, 0x00, 0x72};
  X509NameAttribute value(der::Input(), CBS_ASN1_UNIVERSALSTRING,
                          der::Input(der));
  std::string result_unsafe;
  ASSERT_TRUE(value.ValueAsStringUnsafe(&result_unsafe));
  ASSERT_EQ("foobar", result_unsafe);
  std::string result;
  ASSERT_TRUE(value.ValueAsString(&result));
  ASSERT_EQ("foobar", result);
}